

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int BrotliEncoderCompressStreamFast
              (BrotliEncoderState *s,BrotliEncoderOperation op,size_t *available_in,
              uint8_t **next_in,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  int iVar1;
  uint32_t *puVar2;
  uint8_t *puVar3;
  int *table_00;
  ulong uVar4;
  bool local_13a;
  bool local_139;
  uint8_t *local_138;
  MemoryManager *local_130;
  uint32_t *local_128;
  uint32_t *local_120;
  uint32_t *local_118;
  size_t out_bytes_1;
  size_t out_bytes;
  int *table;
  size_t table_size;
  size_t storage_ix;
  uint8_t *storage;
  uint8_t *puStack_d8;
  int inplace;
  size_t max_out_size;
  int force_flush;
  int is_last;
  size_t block_size;
  MemoryManager *m;
  uint8_t *literal_buf;
  uint8_t *tmp_literal_buf;
  uint32_t *command_buf;
  uint32_t *tmp_command_buf;
  size_t buf_size;
  size_t block_size_limit;
  uint8_t **next_out_local;
  size_t *available_out_local;
  uint8_t **next_in_local;
  size_t *available_in_local;
  BrotliEncoderState *pBStack_60;
  BrotliEncoderOperation op_local;
  BrotliEncoderState *s_local;
  uint8_t *local_50;
  size_t local_48;
  uint32_t *local_40;
  undefined8 local_38;
  uint32_t *local_30;
  uint32_t *local_28;
  
  buf_size = 1L << ((byte)(s->params).lgwin & 0x3f);
  local_28 = (uint32_t *)*available_in;
  local_118 = (uint32_t *)buf_size;
  if (local_28 < buf_size) {
    local_118 = local_28;
  }
  local_38 = 0x20000;
  local_40 = local_118;
  if (local_118 < (uint32_t *)0x20001) {
    local_120 = local_118;
  }
  else {
    local_120 = (uint32_t *)0x20000;
  }
  tmp_command_buf = local_120;
  command_buf = (uint32_t *)0x0;
  tmp_literal_buf = (uint8_t *)0x0;
  literal_buf = (uint8_t *)0x0;
  m = (MemoryManager *)0x0;
  block_size = (size_t)&s->memory_manager_;
  if (((s->params).quality == 0) || ((s->params).quality == 1)) {
    block_size_limit = (size_t)next_out;
    next_out_local = (uint8_t **)available_out;
    available_out_local = (size_t *)next_in;
    next_in_local = (uint8_t **)available_in;
    available_in_local._4_4_ = op;
    pBStack_60 = s;
    local_30 = (uint32_t *)buf_size;
    if ((s->params).quality == 1) {
      if ((s->command_buf_ == (uint32_t *)0x0) && (local_120 == (uint32_t *)0x20000)) {
        puVar2 = (uint32_t *)BrotliAllocate((MemoryManager *)block_size,0x80000);
        pBStack_60->command_buf_ = puVar2;
        puVar3 = (uint8_t *)BrotliAllocate((MemoryManager *)block_size,0x20000);
        pBStack_60->literal_buf_ = puVar3;
      }
      if (pBStack_60->command_buf_ == (uint32_t *)0x0) {
        if (tmp_command_buf == (uint32_t *)0x0) {
          local_128 = (uint32_t *)0x0;
        }
        else {
          local_128 = (uint32_t *)
                      BrotliAllocate((MemoryManager *)block_size,(long)tmp_command_buf << 2);
        }
        command_buf = local_128;
        if (tmp_command_buf == (uint32_t *)0x0) {
          local_130 = (MemoryManager *)0x0;
        }
        else {
          local_130 = (MemoryManager *)
                      BrotliAllocate((MemoryManager *)block_size,(size_t)tmp_command_buf);
        }
        literal_buf = (uint8_t *)local_130;
        tmp_literal_buf = (uint8_t *)command_buf;
        m = local_130;
      }
      else {
        tmp_literal_buf = (uint8_t *)pBStack_60->command_buf_;
        m = (MemoryManager *)pBStack_60->literal_buf_;
      }
    }
    while( true ) {
      do {
        iVar1 = InjectFlushOrPushOutput
                          (pBStack_60,(size_t *)next_out_local,(uint8_t **)block_size_limit,
                           total_out);
      } while (iVar1 != 0);
      if (((pBStack_60->available_out_ != 0) ||
          (pBStack_60->stream_state_ != BROTLI_STREAM_PROCESSING)) ||
         ((*next_in_local == (uint8_t *)0x0 &&
          (available_in_local._4_4_ == BROTLI_OPERATION_PROCESS)))) break;
      local_48 = buf_size;
      local_50 = *next_in_local;
      local_138 = local_50;
      if (buf_size < local_50) {
        local_138 = (uint8_t *)buf_size;
      }
      _force_flush = local_138;
      local_139 = *next_in_local == local_138 && available_in_local._4_4_ == BROTLI_OPERATION_FINISH
      ;
      max_out_size._4_4_ = (uint)local_139;
      local_13a = *next_in_local == local_138 && available_in_local._4_4_ == BROTLI_OPERATION_FLUSH;
      max_out_size._0_4_ = (uint)local_13a;
      puStack_d8 = (uint8_t *)((long)local_138 * 2 + 0x1f7);
      storage._4_4_ = 1;
      storage_ix = 0;
      table_size = (size_t)pBStack_60->last_bytes_bits_;
      if (((uint)max_out_size == 0) || (local_138 != (uint8_t *)0x0)) {
        if (*next_out_local < puStack_d8) {
          storage._4_4_ = 0;
          storage_ix = (size_t)GetBrotliStorage(pBStack_60,(size_t)puStack_d8);
        }
        else {
          storage_ix = *(size_t *)block_size_limit;
        }
        *(char *)storage_ix = (char)pBStack_60->last_bytes_;
        *(char *)(storage_ix + 1) = (char)(pBStack_60->last_bytes_ >> 8);
        table_00 = GetHashTable(pBStack_60,(pBStack_60->params).quality,(size_t)_force_flush,
                                (size_t *)&table);
        if ((pBStack_60->params).quality == 0) {
          BrotliCompressFragmentFast
                    ((MemoryManager *)block_size,(uint8_t *)*available_out_local,
                     (size_t)_force_flush,max_out_size._4_4_,table_00,(size_t)table,
                     pBStack_60->cmd_depths_,pBStack_60->cmd_bits_,&pBStack_60->cmd_code_numbits_,
                     pBStack_60->cmd_code_,&table_size,(uint8_t *)storage_ix);
        }
        else {
          BrotliCompressFragmentTwoPass
                    ((MemoryManager *)block_size,(uint8_t *)*available_out_local,
                     (size_t)_force_flush,max_out_size._4_4_,(uint32_t *)tmp_literal_buf,
                     (uint8_t *)m,table_00,(size_t)table,&table_size,(uint8_t *)storage_ix);
        }
        *available_out_local = (size_t)(_force_flush + *available_out_local);
        *next_in_local = *next_in_local + -(long)_force_flush;
        if (storage._4_4_ == 0) {
          pBStack_60->next_out_ = (uint8_t *)storage_ix;
          pBStack_60->available_out_ = table_size >> 3;
        }
        else {
          uVar4 = table_size >> 3;
          *(ulong *)block_size_limit = uVar4 + *(long *)block_size_limit;
          *next_out_local = *next_out_local + -uVar4;
          pBStack_60->total_out_ = uVar4 + pBStack_60->total_out_;
          if (total_out != (size_t *)0x0) {
            *total_out = pBStack_60->total_out_;
          }
        }
        pBStack_60->last_bytes_ = (ushort)*(byte *)(storage_ix + (table_size >> 3));
        pBStack_60->last_bytes_bits_ = (byte)table_size & 7;
        if ((uint)max_out_size != 0) {
          pBStack_60->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
        }
        if (max_out_size._4_4_ != 0) {
          pBStack_60->stream_state_ = BROTLI_STREAM_FINISHED;
        }
      }
      else {
        pBStack_60->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
      }
    }
    BrotliFree((MemoryManager *)block_size,command_buf);
    command_buf = (uint32_t *)0x0;
    BrotliFree((MemoryManager *)block_size,literal_buf);
    literal_buf = (uint8_t *)0x0;
    CheckFlushComplete(pBStack_60);
    s_local._4_4_ = 1;
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static BROTLI_BOOL BrotliEncoderCompressStreamFast(
    BrotliEncoderState* s, BrotliEncoderOperation op, size_t* available_in,
    const uint8_t** next_in, size_t* available_out, uint8_t** next_out,
    size_t* total_out) {
  const size_t block_size_limit = (size_t)1 << s->params.lgwin;
  const size_t buf_size = BROTLI_MIN(size_t, kCompressFragmentTwoPassBlockSize,
      BROTLI_MIN(size_t, *available_in, block_size_limit));
  uint32_t* tmp_command_buf = NULL;
  uint32_t* command_buf = NULL;
  uint8_t* tmp_literal_buf = NULL;
  uint8_t* literal_buf = NULL;
  MemoryManager* m = &s->memory_manager_;
  if (s->params.quality != FAST_ONE_PASS_COMPRESSION_QUALITY &&
      s->params.quality != FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    if (!s->command_buf_ && buf_size == kCompressFragmentTwoPassBlockSize) {
      s->command_buf_ =
          BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
      s->literal_buf_ =
          BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    if (s->command_buf_) {
      command_buf = s->command_buf_;
      literal_buf = s->literal_buf_;
    } else {
      tmp_command_buf = BROTLI_ALLOC(m, uint32_t, buf_size);
      tmp_literal_buf = BROTLI_ALLOC(m, uint8_t, buf_size);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
      command_buf = tmp_command_buf;
      literal_buf = tmp_literal_buf;
    }
  }

  while (BROTLI_TRUE) {
    if (InjectFlushOrPushOutput(s, available_out, next_out, total_out)) {
      continue;
    }

    /* Compress block only when internal output buffer is empty, stream is not
       finished, there is no pending flush request, and there is either
       additional input or pending operation. */
    if (s->available_out_ == 0 &&
        s->stream_state_ == BROTLI_STREAM_PROCESSING &&
        (*available_in != 0 || op != BROTLI_OPERATION_PROCESS)) {
      size_t block_size = BROTLI_MIN(size_t, block_size_limit, *available_in);
      BROTLI_BOOL is_last =
          (*available_in == block_size) && (op == BROTLI_OPERATION_FINISH);
      BROTLI_BOOL force_flush =
          (*available_in == block_size) && (op == BROTLI_OPERATION_FLUSH);
      size_t max_out_size = 2 * block_size + 503;
      BROTLI_BOOL inplace = BROTLI_TRUE;
      uint8_t* storage = NULL;
      size_t storage_ix = s->last_bytes_bits_;
      size_t table_size;
      int* table;

      if (force_flush && block_size == 0) {
        s->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
        continue;
      }
      if (max_out_size <= *available_out) {
        storage = *next_out;
      } else {
        inplace = BROTLI_FALSE;
        storage = GetBrotliStorage(s, max_out_size);
        if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
      }
      storage[0] = (uint8_t)s->last_bytes_;
      storage[1] = (uint8_t)(s->last_bytes_ >> 8);
      table = GetHashTable(s, s->params.quality, block_size, &table_size);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

      if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
        BrotliCompressFragmentFast(m, *next_in, block_size, is_last, table,
            table_size, s->cmd_depths_, s->cmd_bits_, &s->cmd_code_numbits_,
            s->cmd_code_, &storage_ix, storage);
        if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
      } else {
        BrotliCompressFragmentTwoPass(m, *next_in, block_size, is_last,
            command_buf, literal_buf, table, table_size,
            &storage_ix, storage);
        if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
      }
      *next_in += block_size;
      *available_in -= block_size;
      if (inplace) {
        size_t out_bytes = storage_ix >> 3;
        BROTLI_DCHECK(out_bytes <= *available_out);
        BROTLI_DCHECK((storage_ix & 7) == 0 || out_bytes < *available_out);
        *next_out += out_bytes;
        *available_out -= out_bytes;
        s->total_out_ += out_bytes;
        if (total_out) *total_out = s->total_out_;
      } else {
        size_t out_bytes = storage_ix >> 3;
        s->next_out_ = storage;
        s->available_out_ = out_bytes;
      }
      s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
      s->last_bytes_bits_ = storage_ix & 7u;

      if (force_flush) s->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
      if (is_last) s->stream_state_ = BROTLI_STREAM_FINISHED;
      continue;
    }
    break;
  }
  BROTLI_FREE(m, tmp_command_buf);
  BROTLI_FREE(m, tmp_literal_buf);
  CheckFlushComplete(s);
  return BROTLI_TRUE;
}